

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

void __thiscall ON_Font::ON_Font(ON_Font *this,ON_Font *src)

{
  this->m_runtime_serial_number = (uint)(src == (ON_Font *)0x10);
  this->m_windows_logfont_weight = 400;
  this->m_point_size = 0.0;
  this->m_apple_font_weight_trait = 0.0;
  this->m_font_weight = Normal;
  this->m_font_style = Upright;
  this->m_font_stretch = Medium;
  this->m_font_bUnderlined = false;
  this->m_font_bStrikethrough = false;
  this->m_logfont_charset = '\x01';
  this->m_font_origin = Unset;
  this->m_font_type = src == (ON_Font *)0x10;
  ON_wString::ON_wString(&this->m_locale_name);
  ON_wString::ON_wString(&this->m_loc_postscript_name);
  ON_wString::ON_wString(&this->m_en_postscript_name);
  ON_wString::ON_wString(&this->m_loc_family_name);
  ON_wString::ON_wString(&this->m_en_family_name);
  ON_wString::ON_wString(&this->m_loc_face_name);
  ON_wString::ON_wString(&this->m_en_face_name);
  ON_wString::ON_wString(&this->m_loc_windows_logfont_name);
  ON_wString::ON_wString(&this->m_en_windows_logfont_name);
  (this->m_panose1).m_prop6 = '\0';
  (this->m_panose1).m_prop7 = '\0';
  (this->m_panose1).m_prop8 = '\0';
  (this->m_panose1).m_prop9 = '\0';
  this->m_simulated = '\0';
  this->m_reserved1 = '\0';
  (this->m_panose1).m_family_kind = Any;
  (this->m_panose1).m_prop1 = '\0';
  (this->m_panose1).m_prop2 = '\0';
  (this->m_panose1).m_prop3 = '\0';
  (this->m_panose1).m_prop4 = '\0';
  (this->m_panose1).m_prop5 = '\0';
  ON_SHA1_Hash::ON_SHA1_Hash(&this->m_font_characteristics_hash);
  this->m_apple_font_width_trait = -1.23432101234321e+308;
  this->m_outline_figure_type = Unset;
  this->m_quartet_member = Unset;
  this->m_reserved2 = 0;
  this->m_reserved3 = 0;
  this->m_reserved4 = 0.0;
  (this->m_font_glyph_cache).super___shared_ptr<ON_FontGlyphCache,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->m_font_glyph_cache).super___shared_ptr<ON_FontGlyphCache,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->m_free_type_face = (ON_FreeTypeFace *)0x0;
  this->m_managed_installed_font_and_bits = 0;
  Internal_CopyFrom(this,src);
  return;
}

Assistant:

ON_Font::ON_Font(const ON_Font& src)
  : m_runtime_serial_number(  (ON_PTR_SEMAPHORE2 == ((ON__UINT_PTR)&src)) ? 1 : 0)
  , m_font_type( (ON_PTR_SEMAPHORE2 == ((ON__UINT_PTR)&src)) ? ON_Font::FontType::ManagedFont : ON_Font::FontType::Unset)
{
  // (ON_PTR_SEMAPHORE1 == ((ON__UINT_PTR)&src)) means we are constructing ON_Font::Unset.
  // (ON_PTR_SEMAPHORE2 == ((ON__UINT_PTR)&src)) means we are constructing ON_Font::Default.
  // Otherwise "this" should be an ordinary and unmanaged font.
  // See opennurbs_statics.cpp and ON_Font::CopyHelper() for more information.
  Internal_CopyFrom(src);
}